

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5_stream.hpp
# Opt level: O1

void __thiscall
libtorrent::socks5_stream::
connect2<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (socks5_stream *this,error_code *e,
          _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  byte bVar1;
  byte *pbVar2;
  pointer pcVar3;
  bool bVar4;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar5;
  long *plVar6;
  size_t sVar7;
  transfer_all_t local_61;
  error_code local_60;
  undefined8 uStack_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  socks5_stream *local_38;
  mutable_buffer local_30;
  
  bVar4 = aux::proxy_base::
          handle_error<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                    (&this->super_proxy_base,e,h);
  if (bVar4) {
    return;
  }
  pbVar2 = (byte *)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  bVar1 = pbVar2[1];
  if (this->m_version == 4) {
    if (*pbVar2 != 0) {
      local_60 = socks_error::make_error_code(general_failure);
      goto switchD_001ecb25_default;
    }
    if (bVar1 == 0x5a) {
LAB_001ecb40:
      pcVar3 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      operator_delete(pbVar2,(long)pcVar3 - (long)pbVar2);
      UNRECOVERED_JUMPTABLE = (code *)h->_M_f;
      plVar6 = (long *)((long)&((h->_M_bound_args).
                                super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
                                .
                                super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>
                                ._M_head_impl.
                                super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_http_connection + *(long *)&h->field_0x8);
      if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
        UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar6 + -1);
      }
      (*UNRECOVERED_JUMPTABLE)(plVar6,e);
      return;
    }
    local_60 = socks_error::make_error_code(general_failure);
    if (bVar1 == 0x5d) {
      local_60 = socks_error::make_error_code(identd_error);
      goto switchD_001ecb25_default;
    }
    if (bVar1 == 0x5c) {
      local_60 = socks_error::make_error_code(no_identd);
      goto switchD_001ecb25_default;
    }
    if (bVar1 != 0x5b) goto switchD_001ecb25_default;
switchD_001ecb25_caseD_5:
    uVar5 = 0x10000006f;
    goto LAB_001ecce7;
  }
  if (this->m_version != 5) {
    return;
  }
  if (*pbVar2 < 5) {
    local_60 = socks_error::make_error_code(unsupported_version);
    goto switchD_001ecb25_default;
  }
  if (bVar1 == 0) {
    bVar1 = pbVar2[3];
    if (bVar1 == 4) {
      sVar7 = 0xc;
    }
    else {
      if (bVar1 != 3) {
        if (bVar1 == 1) goto LAB_001ecb40;
        local_60.cat_ =
             &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
        ;
        local_60.val_ = 0x61;
        local_60.failed_ = true;
        local_60._5_3_ = 0;
        goto switchD_001ecb25_default;
      }
      sVar7 = (ulong)pbVar2[4] - 3;
    }
    ::std::vector<char,_std::allocator<char>_>::resize
              (&this->m_buffer,
               (size_type)
               ((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish + (sVar7 - (long)pbVar2)));
    local_30.data_ =
         (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish + -sVar7;
    local_60.cat_ = (error_category *)h->_M_f;
    uStack_50 = *(undefined8 *)&h->field_0x8;
    local_48 = (h->_M_bound_args).
               super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
               .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
               _M_head_impl.
               super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    _Stack_40._M_pi =
         (h->_M_bound_args).
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
         _M_head_impl.
         super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    (h->_M_bound_args).
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (h->_M_bound_args).
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_60._0_8_ = this;
    local_38 = this;
    local_30.size_ = sVar7;
    boost::asio::detail::
    initiate_async_read_buffer_sequence<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>>
    ::operator()((initiate_async_read_buffer_sequence<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>>
                  *)&local_38,
                 (wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_socks5_stream_hpp:480:27),_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
                  *)&local_60,&local_30,&local_61);
    if (_Stack_40._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    return;
  }
  local_60 = socks_error::make_error_code(general_failure);
  switch(bVar1) {
  case 2:
    uVar5 = 0x100000001;
    break;
  case 3:
    uVar5 = 0x100000065;
    break;
  case 4:
    uVar5 = 0x100000071;
    break;
  case 5:
    goto switchD_001ecb25_caseD_5;
  case 6:
    uVar5 = 0x10000006e;
    break;
  case 7:
    local_60 = socks_error::make_error_code(command_not_supported);
    goto switchD_001ecb25_default;
  case 8:
    uVar5 = 0x100000061;
    break;
  default:
    goto switchD_001ecb25_default;
  }
LAB_001ecce7:
  local_60.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_60.val_ = (int)uVar5;
  local_60.failed_ = (bool)(char)((ulong)uVar5 >> 0x20);
  local_60._5_3_ = (int3)((ulong)uVar5 >> 0x28);
switchD_001ecb25_default:
  UNRECOVERED_JUMPTABLE = (code *)h->_M_f;
  plVar6 = (long *)((long)&((h->_M_bound_args).
                            super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
                            .
                            super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>
                            ._M_head_impl.
                            super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_vptr_http_connection + *(long *)&h->field_0x8);
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar6 + -1);
  }
  (*UNRECOVERED_JUMPTABLE)
            (plVar6,(wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_socks5_stream_hpp:480:27),_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
                     *)&local_60);
  return;
}

Assistant:

void connect2(error_code const& e, Handler h)
	{
		COMPLETE_ASYNC("socks5_stream::connect2");
		if (handle_error(e, std::move(h))) return;

		using namespace libtorrent::aux;

		char const* p = &m_buffer[0];
		int const version = read_uint8(p);
		int const response = read_uint8(p);

		if (m_version == 5)
		{
			if (version < m_version)
			{
				std::move(h)(error_code(socks_error::unsupported_version));
				return;
			}
			if (response != 0)
			{
				error_code ec(socks_error::general_failure);
				switch (response)
				{
					case 2: ec = boost::asio::error::no_permission; break;
					case 3: ec = boost::asio::error::network_unreachable; break;
					case 4: ec = boost::asio::error::host_unreachable; break;
					case 5: ec = boost::asio::error::connection_refused; break;
					case 6: ec = boost::asio::error::timed_out; break;
					case 7: ec = socks_error::command_not_supported; break;
					case 8: ec = boost::asio::error::address_family_not_supported; break;
				}
				std::move(h)(ec);
				return;
			}
			p += 1; // reserved
			int const atyp = read_uint8(p);
			// read the proxy IP it was bound to (this is variable length depending
			// on address type)
			if (atyp == 1)
			{
				std::vector<char>().swap(m_buffer);
				std::move(h)(e);
				return;
			}
			std::size_t extra_bytes = 0;
			if (atyp == 4)
			{
				// IPv6
				extra_bytes = 12;
			}
			else if (atyp == 3)
			{
				// hostname with length prefix
				extra_bytes = read_uint8(p) - 3;
			}
			else
			{
				std::move(h)(error_code(boost::asio::error::address_family_not_supported));
				return;
			}
			m_buffer.resize(m_buffer.size() + extra_bytes);

			ADD_OUTSTANDING_ASYNC("socks5_stream::connect3");
			TORRENT_ASSERT(extra_bytes > 0);
			async_read(m_sock, boost::asio::buffer(&m_buffer[m_buffer.size() - extra_bytes], extra_bytes)
				, aux::wrap_allocator([this](error_code const& ec, std::size_t, Handler hn) {
					connect3(ec, std::move(hn));
				}, std::move(h)));
		}
		else if (m_version == 4)
		{
			if (version != 0)
			{
				std::move(h)(error_code(socks_error::general_failure));
				return;
			}

			// access granted
			if (response == 90)
			{
				std::vector<char>().swap(m_buffer);
				std::move(h)(e);
				return;
			}

			error_code ec(socks_error::general_failure);
			switch (response)
			{
				case 91: ec = boost::asio::error::connection_refused; break;
				case 92: ec = socks_error::no_identd; break;
				case 93: ec = socks_error::identd_error; break;
			}
			std::move(h)(ec);
		}
	}